

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O0

void ApplicativeHelper::getHeadAndArgs(Term *term,TermList *head,Deque<Kernel::TermList> *args)

{
  bool bVar1;
  TermList *pTVar2;
  Deque<Kernel::TermList> *in_RDX;
  uint64_t *in_RSI;
  Term *in_RDI;
  Deque<Kernel::TermList> *this;
  TermList in_stack_ffffffffffffffe0;
  Term *local_8;
  
  bVar1 = Lib::Deque<Kernel::TermList>::isEmpty(in_RDX);
  local_8 = in_RDI;
  if (!bVar1) {
    Lib::Deque<Kernel::TermList>::reset(in_RDX);
  }
  while( true ) {
    bVar1 = Kernel::Term::isApplication((Term *)in_stack_ffffffffffffffe0._content);
    if (!bVar1) {
      return;
    }
    this = in_RDX;
    pTVar2 = Kernel::Term::nthArgument(local_8,3);
    in_stack_ffffffffffffffe0._content = pTVar2->_content;
    Lib::Deque<Kernel::TermList>::push_front(this,in_stack_ffffffffffffffe0);
    pTVar2 = Kernel::Term::nthArgument(local_8,2);
    *in_RSI = pTVar2->_content;
    bVar1 = Kernel::TermList::isTerm((TermList *)0x8413a2);
    if (!bVar1) break;
    local_8 = Kernel::TermList::term((TermList *)0x8413b2);
  }
  return;
}

Assistant:

void ApplicativeHelper::getHeadAndArgs(const Term* term, TermList& head, Deque<TermList>& args)
{
  ASS(term->isApplication());

  if(!args.isEmpty()){ args.reset(); }

  while(term->isApplication()){
    args.push_front(*term->nthArgument(3)); 
    head = *term->nthArgument(2);
    if(head.isTerm()){ 
      term = head.term();
    } else {  break; }
  }  
}